

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
duckdb_re2::NamedCapturesWalker::ShortVisit(NamedCapturesWalker *this,Regexp *re,Ignored ignored)

{
  ostream *poVar1;
  Ignored in_EDX;
  char *in_stack_fffffffffffffe48;
  LogMessage *this_00;
  LogMessage *in_stack_fffffffffffffe60;
  LogMessage local_198;
  Ignored local_14;
  
  this_00 = &local_198;
  local_14 = in_EDX;
  LogMessage::LogMessage(this_00,in_stack_fffffffffffffe48,0);
  poVar1 = LogMessage::stream(this_00);
  std::operator<<(poVar1,"NamedCapturesWalker::ShortVisit called");
  LogMessage::~LogMessage(in_stack_fffffffffffffe60);
  return local_14;
}

Assistant:

virtual Ignored ShortVisit(Regexp* re, Ignored ignored) {
    // Should never be called: we use Walk(), not WalkExponential().
#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    LOG(DFATAL) << "NamedCapturesWalker::ShortVisit called";
#endif
    return ignored;
  }